

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

combinator *
parser::memoize<hwl::ControlFlow>
          (combinator *__return_storage_ptr__,ind id,ControlFlow *psVal,combinator *f)

{
  combinator *this;
  anon_class_48_3_83fa9d98 local_40;
  
  this = &local_40.f;
  local_40.id = id;
  local_40.psVal = psVal;
  std::function<bool_(parser::state_&)>::function(this,f);
  std::function<bool(parser::state&)>::
  function<parser::memoize<hwl::ControlFlow>(unsigned_long,hwl::ControlFlow&,std::function<bool(parser::state&)>const&)::_lambda(parser::state&)_1_,void>
            ((function<bool(parser::state&)> *)__return_storage_ptr__,&local_40);
  if (local_40.f.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_40.f.super__Function_base._M_manager)
              ((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

combinator memoize(ind id, T& psVal, const combinator& f) {
		return [id,&psVal,f](state& ps) {
			memo m;
			if ( ps.memo(id, m) ) {
				if ( m.success ) {
					m.result.bind(psVal);
					ps.set_posn(m.end);
				}
			} else {
				posn psStart = ps.posn();
				m.success = f(ps);
				m.end = ps.posn();
				if ( m.success ) m.result = psVal;
				ps.set_memo(psStart, id, m);
			}
			return m.success;
		};
	}